

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::Generators::Generators<unsigned_long_long>::populate
          (Generators<unsigned_long_long> *this,unsigned_long_long *val)

{
  pointer *__ptr;
  GeneratorWrapper<unsigned_long_long> local_18;
  
  local_18.m_generator._M_t.
  super___uniq_ptr_impl<Catch::Generators::IGenerator<unsigned_long_long>,_std::default_delete<Catch::Generators::IGenerator<unsigned_long_long>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unsigned_long_long>_*,_std::default_delete<Catch::Generators::IGenerator<unsigned_long_long>_>_>
  .super__Head_base<0UL,_Catch::Generators::IGenerator<unsigned_long_long>_*,_false>._M_head_impl =
       (unique_ptr<Catch::Generators::IGenerator<unsigned_long_long>,_std::default_delete<Catch::Generators::IGenerator<unsigned_long_long>_>_>
        )operator_new(0x10);
  *(undefined ***)
   local_18.m_generator._M_t.
   super___uniq_ptr_impl<Catch::Generators::IGenerator<unsigned_long_long>,_std::default_delete<Catch::Generators::IGenerator<unsigned_long_long>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unsigned_long_long>_*,_std::default_delete<Catch::Generators::IGenerator<unsigned_long_long>_>_>
   .super__Head_base<0UL,_Catch::Generators::IGenerator<unsigned_long_long>_*,_false>._M_head_impl =
       &PTR__GeneratorUntypedBase_00317bc8;
  *(unsigned_long_long *)
   ((long)local_18.m_generator._M_t.
          super___uniq_ptr_impl<Catch::Generators::IGenerator<unsigned_long_long>,_std::default_delete<Catch::Generators::IGenerator<unsigned_long_long>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unsigned_long_long>_*,_std::default_delete<Catch::Generators::IGenerator<unsigned_long_long>_>_>
          .super__Head_base<0UL,_Catch::Generators::IGenerator<unsigned_long_long>_*,_false>.
          _M_head_impl + 8) = *val;
  std::
  vector<Catch::Generators::GeneratorWrapper<unsigned_long_long>,std::allocator<Catch::Generators::GeneratorWrapper<unsigned_long_long>>>
  ::emplace_back<Catch::Generators::GeneratorWrapper<unsigned_long_long>>
            ((vector<Catch::Generators::GeneratorWrapper<unsigned_long_long>,std::allocator<Catch::Generators::GeneratorWrapper<unsigned_long_long>>>
              *)&this->m_generators,&local_18);
  if (local_18.m_generator._M_t.
      super___uniq_ptr_impl<Catch::Generators::IGenerator<unsigned_long_long>,_std::default_delete<Catch::Generators::IGenerator<unsigned_long_long>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unsigned_long_long>_*,_std::default_delete<Catch::Generators::IGenerator<unsigned_long_long>_>_>
      .super__Head_base<0UL,_Catch::Generators::IGenerator<unsigned_long_long>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_data<Catch::Generators::IGenerator<unsigned_long_long>,_std::default_delete<Catch::Generators::IGenerator<unsigned_long_long>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_18.m_generator._M_t.
                          super___uniq_ptr_impl<Catch::Generators::IGenerator<unsigned_long_long>,_std::default_delete<Catch::Generators::IGenerator<unsigned_long_long>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unsigned_long_long>_*,_std::default_delete<Catch::Generators::IGenerator<unsigned_long_long>_>_>
                          .
                          super__Head_base<0UL,_Catch::Generators::IGenerator<unsigned_long_long>_*,_false>
                          ._M_head_impl + 8))();
  }
  return;
}

Assistant:

void populate(T&& val) {
            m_generators.emplace_back(value(std::forward<T>(val)));
        }